

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputCase12::Run(BasicInputCase12 *this)

{
  float *pfVar1;
  long lVar2;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  Vector<float,_3> local_2c;
  Vector<float,_3> local_20;
  uint local_14;
  BasicInputCase12 *pBStack_10;
  GLuint i;
  BasicInputCase12 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x18,(void *)0x0,0x88e4);
  tcu::Vector<float,_3>::Vector(&local_20,1.0,2.0,3.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_20,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0xc,pfVar1);
  tcu::Vector<float,_3>::Vector(&local_2c,4.0,5.0,6.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_2c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0xc,pfVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,3,0x1406,'\0',0xc,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,1);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1);
  tcu::Vector<float,_4>::Vector(&local_3c,1.0,2.0,3.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_3c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_3c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_4c,1.0,2.0,3.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[1].m_data = local_4c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[1].m_data + 2) = local_4c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_5c,4.0,5.0,6.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_5c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_5c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_6c,4.0,5.0,6.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x11].m_data = local_6c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x11].m_data + 2) =
       local_6c.m_data._8_8_;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec3), &Vec3(1.0f, 2.0f, 3.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(Vec3), &Vec3(4.0f, 5.0f, 6.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 12, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glVertexAttribFormat(0, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribBinding(0, 1);

		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);

		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 1.0f);
		expected_data[1]	  = Vec4(1.0f, 2.0f, 3.0f, 1.0f);
		expected_data[0 + 16] = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[1 + 16] = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		return BasicInputBase::Run();
	}